

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O2

DecoratorDataHandle __thiscall
Rml::DecoratorStraightGradient::GenerateElementData
          (DecoratorStraightGradient *this,Element *element,BoxArea paint_area)

{
  Colour<unsigned_char,_255,_true> v0;
  Colour<unsigned_char,_255,_true> v1;
  ColourbPremultiplied CVar1;
  ComputedValues *pCVar2;
  RenderManager *this_00;
  RenderManager *mesh_00;
  int i;
  long lVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float local_a8;
  float fStack_a4;
  Mesh mesh;
  RenderBox render_box;
  
  Element::GetRenderBox(&render_box,element,paint_area,0);
  pCVar2 = Element::GetComputedValues(element);
  fVar6 = (pCVar2->inherited).opacity;
  mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  MeshUtilities::GenerateBackground(&mesh,&render_box,(ColourbPremultiplied)0xff000000);
  v0 = Colour<unsigned_char,255,false>::ToPremultiplied<std::integral_constant<bool,false>,void>
                 ((Colour<unsigned_char,255,false> *)&this->start,fVar6);
  v1 = Colour<unsigned_char,255,false>::ToPremultiplied<std::integral_constant<bool,false>,void>
                 ((Colour<unsigned_char,255,false> *)&this->stop,fVar6);
  if (this->direction == Horizontal) {
    lVar4 = 0;
    for (lVar3 = 0;
        lVar3 < (int)(((long)mesh.vertices.
                             super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)mesh.vertices.
                            super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x14); lVar3 = lVar3 + 1) {
      local_a8 = render_box.fill_size.x;
      local_a8 = (*(float *)((long)&((mesh.vertices.
                                      super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->position).x + lVar4
                            ) - render_box.border_widths._M_elems[3]) / local_a8;
      fVar6 = 1.0;
      if (local_a8 <= 1.0) {
        fVar6 = local_a8;
      }
      CVar1 = Math::RoundedLerp((float)(~-(uint)(local_a8 < 0.0) & (uint)fVar6),v0,v1);
      *(ColourbPremultiplied *)
       (&((mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
           super__Vector_impl_data._M_start)->colour).red + lVar4) = CVar1;
      lVar4 = lVar4 + 0x14;
    }
  }
  else if (this->direction == Vertical) {
    fStack_a4 = render_box.fill_size.y;
    lVar4 = 0;
    for (lVar3 = 0;
        lVar3 < (int)(((long)mesh.vertices.
                             super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)mesh.vertices.
                            super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x14); lVar3 = lVar3 + 1) {
      fVar5 = (*(float *)((long)&((mesh.vertices.
                                   super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->position).y + lVar4) -
              render_box.border_widths._M_elems[0]) / fStack_a4;
      fVar6 = 1.0;
      if (fVar5 <= 1.0) {
        fVar6 = fVar5;
      }
      CVar1 = Math::RoundedLerp((float)(~-(uint)(fVar5 < 0.0) & (uint)fVar6),v0,v1);
      *(ColourbPremultiplied *)
       (&((mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
           super__Vector_impl_data._M_start)->colour).red + lVar4) = CVar1;
      lVar4 = lVar4 + 0x14;
    }
  }
  this_00 = (RenderManager *)operator_new(0x10);
  mesh_00 = Element::GetRenderManager(element);
  RenderManager::MakeGeometry(this_00,(Mesh *)mesh_00);
  Mesh::~Mesh(&mesh);
  return (DecoratorDataHandle)this_00;
}

Assistant:

DecoratorDataHandle DecoratorStraightGradient::GenerateElementData(Element* element, BoxArea paint_area) const
{
	const RenderBox render_box = element->GetRenderBox(paint_area);
	const ComputedValues& computed = element->GetComputedValues();
	const float opacity = computed.opacity();

	Mesh mesh;
	MeshUtilities::GenerateBackground(mesh, render_box, ColourbPremultiplied());

	ColourbPremultiplied colour_start = start.ToPremultiplied(opacity);
	ColourbPremultiplied colour_stop = stop.ToPremultiplied(opacity);

	const Vector2f offset = render_box.GetFillOffset();
	const Vector2f size = render_box.GetFillSize();

	Vector<Vertex>& vertices = mesh.vertices;

	if (direction == Direction::Horizontal)
	{
		for (int i = 0; i < (int)vertices.size(); i++)
		{
			const float t = Math::Clamp((vertices[i].position.x - offset.x) / size.x, 0.0f, 1.0f);
			vertices[i].colour = Math::RoundedLerp(t, colour_start, colour_stop);
		}
	}
	else if (direction == Direction::Vertical)
	{
		for (int i = 0; i < (int)vertices.size(); i++)
		{
			const float t = Math::Clamp((vertices[i].position.y - offset.y) / size.y, 0.0f, 1.0f);
			vertices[i].colour = Math::RoundedLerp(t, colour_start, colour_stop);
		}
	}

	Geometry* geometry = new Geometry(element->GetRenderManager()->MakeGeometry(std::move(mesh)));

	return reinterpret_cast<DecoratorDataHandle>(geometry);
}